

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O0

void worker_error(worker_thread *thr,lzma_ret ret)

{
  bool bVar1;
  uint mythread_j_187;
  uint mythread_i_187;
  lzma_ret ret_local;
  worker_thread *thr_local;
  
  if (ret == LZMA_OK) {
    __assert_fail("ret != LZMA_OK",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                  ,0xb8,"void worker_error(worker_thread *, lzma_ret)");
  }
  if (ret == LZMA_STREAM_END) {
    __assert_fail("ret != LZMA_STREAM_END",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                  ,0xb9,"void worker_error(worker_thread *, lzma_ret)");
  }
  bVar1 = false;
  while (!bVar1) {
    mythread_mutex_lock(&thr->coder->mutex);
    bVar1 = false;
    while (!bVar1) {
      if (thr->coder->thread_error == LZMA_OK) {
        thr->coder->thread_error = ret;
      }
      mythread_cond_signal(&thr->coder->cond);
      bVar1 = true;
    }
    bVar1 = true;
  }
  mythread_mutex_unlock(&thr->coder->mutex);
  return;
}

Assistant:

static void
worker_error(worker_thread *thr, lzma_ret ret)
{
	assert(ret != LZMA_OK);
	assert(ret != LZMA_STREAM_END);

	mythread_sync(thr->coder->mutex) {
		if (thr->coder->thread_error == LZMA_OK)
			thr->coder->thread_error = ret;

		mythread_cond_signal(&thr->coder->cond);
	}

	return;
}